

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testSpecDowngradeFlexibleShapes(void)

{
  bool bVar1;
  int32 iVar2;
  ModelDescription *pMVar3;
  FeatureType *pFVar4;
  ArrayFeatureType_ShapeRange *this;
  ostream *poVar5;
  Model *this_00;
  undefined1 local_d8 [8];
  Model mlmodel;
  Result local_b8;
  UnaryFunctionLayerParams *params;
  NeuralNetworkLayer *layer;
  NeuralNetwork *nn;
  ArrayFeatureType *outvec;
  FeatureDescription *out;
  SizeRange *array_shape1_range;
  ArrayFeatureType *array_type;
  FeatureDescription *topIn;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::Specification::Model::set_specificationversion((Model *)local_40,3);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)local_40);
  array_type = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_input(pMVar3);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)array_type,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)array_type)
  ;
  array_shape1_range =
       (SizeRange *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::set_datatype
            ((ArrayFeatureType *)array_shape1_range,ArrayFeatureType_ArrayDataType_FLOAT32);
  this = CoreML::Specification::ArrayFeatureType::mutable_shaperange
                   ((ArrayFeatureType *)array_shape1_range);
  out = (FeatureDescription *)
        CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(this);
  CoreML::Specification::SizeRange::set_lowerbound((SizeRange *)out,10);
  CoreML::Specification::SizeRange::set_upperbound((SizeRange *)out,10);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)local_40);
  outvec = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar3);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)outvec,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)outvec);
  nn = (NeuralNetwork *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::set_datatype
            ((ArrayFeatureType *)nn,ArrayFeatureType_ArrayDataType_DOUBLE);
  layer = (NeuralNetworkLayer *)
          CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
  params = (UnaryFunctionLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)layer);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"probs");
  local_b8.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_unary((NeuralNetworkLayer *)params);
  CoreML::Specification::UnaryFunctionLayerParams::set_type
            ((UnaryFunctionLayerParams *)local_b8.m_message._M_storage._M_storage,
             UnaryFunctionLayerParams_Operation_ABS);
  CoreML::validate<(MLModelType)500>(&local_b8,(Model *)local_40);
  bVar1 = CoreML::Result::good(&local_b8);
  if (bVar1) {
    CoreML::Model::Model((Model *)local_d8,(Model *)local_40);
    this_00 = CoreML::Model::getProto((Model *)local_d8);
    iVar2 = CoreML::Specification::Model::specificationversion(this_00);
    if (iVar2 != 3) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1050);
      poVar5 = std::operator<<(poVar5,": error: ");
      poVar5 = std::operator<<(poVar5,
                               "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12"
                              );
      poVar5 = std::operator<<(poVar5," was false, expected true.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    m1._oneof_case_[0]._1_3_ = 0;
    m1._oneof_case_[0]._0_1_ = iVar2 != 3;
    mlmodel.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
    CoreML::Model::~Model((Model *)local_d8);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x104c);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"(res).good()");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
    mlmodel.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
  }
  CoreML::Result::~Result(&local_b8);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testSpecDowngradeFlexibleShapes() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *array_type = topIn->mutable_type()->mutable_multiarraytype();
    array_type->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *array_shape1_range = array_type->mutable_shaperange()->add_sizeranges();
    array_shape1_range->set_lowerbound(10);
    array_shape1_range->set_upperbound(10);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");

    auto *params = layer->mutable_unary();
    params->set_type(Specification::UnaryFunctionLayerParams::ABS);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    Model mlmodel = Model(m1);

    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12);

    return 0;

}